

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

void __thiscall E64::command_t::memory_dump(command_t *this,uint32_t address,int rows)

{
  tty_t *ptVar1;
  uint uVar2;
  int iVar3;
  int i;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int i_1;
  int iVar7;
  
  uVar6 = address & 0xfffffffe;
  iVar3 = 0;
  if (rows < 1) {
    rows = 0;
  }
  for (; iVar3 != rows; iVar3 = iVar3 + 1) {
    tty_t::print(monitor.tty,"\r:%06x ",(ulong)uVar6);
    uVar5 = uVar6;
    for (uVar4 = 0; ptVar1 = monitor.tty, uVar4 != 8; uVar4 = uVar4 + 1) {
      uVar2 = mmu_ic::read_memory_8(machine.mmu,uVar5);
      tty_t::print(ptVar1,"%02x",(ulong)uVar2);
      if ((uVar4 & 1) != 0) {
        tty_t::putchar(monitor.tty,0x20);
      }
      uVar5 = uVar5 + 1 & 0xffffff;
    }
    (monitor.tty)->current_background_color = 0x24f2;
    for (iVar7 = 0; ptVar1 = monitor.tty, iVar7 != 8; iVar7 = iVar7 + 1) {
      uVar5 = mmu_ic::read_memory_8(machine.mmu,uVar6 + iVar7);
      tty_t::put_screencode(monitor.tty,(char)uVar5);
    }
    uVar6 = uVar6 + 8 & 0xffffff;
    (monitor.tty)->current_background_color = 0x12f1;
    ptVar1->cursor_pos = ptVar1->cursor_pos + -0x1c;
  }
  return;
}

Assistant:

void E64::command_t::memory_dump(uint32_t address, int rows)
{
    address = address & 0xfffffffe;  // only even addresses allowed
    
	for (int i=0; i<rows; i++ ) {
		uint32_t temp_address = address;
		monitor.tty->print("\r:%06x ", temp_address);
		for (int i=0; i<8; i++) {
			monitor.tty->print("%02x", machine.mmu->read_memory_8(temp_address));
			if(i & 0b1) monitor.tty->putchar(' ');
			temp_address ++;
			temp_address &= RAM_SIZE - 1;
		}
        
		monitor.tty->current_background_color = COBALT_02;
		
		temp_address = address;
		for (int i=0; i<8; i++) {
			uint8_t temp_byte = machine.mmu->read_memory_8(temp_address);
			monitor.tty->put_screencode(temp_byte);
			temp_address++;
		}
		address += 8;
		address &= RAM_SIZE - 1;
        
		monitor.tty->current_background_color = COBALT_01;
       
		monitor.tty->cursor_pos -= 28;
	}
}